

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTRawBufferCopyAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint32 uVar1;
  JsRTRawBufferCopyAction *pJVar2;
  TTDVar pvVar3;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferCopyAction,(TTD::NSLogEvents::EventKind)62>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar2->Dst = pvVar3;
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar2->Src = pvVar3;
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  pJVar2->DstIndx = uVar1;
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  pJVar2->SrcIndx = uVar1;
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  pJVar2->Count = uVar1;
  return;
}

Assistant:

void JsRTRawBufferCopyAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTRawBufferCopyAction* rbcAction = GetInlineEventDataAs<JsRTRawBufferCopyAction, EventKind::RawBufferCopySync>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            rbcAction->Dst = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            rbcAction->Src = NSSnapValues::ParseTTDVar(false, reader);

            rbcAction->DstIndx = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            rbcAction->SrcIndx = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            rbcAction->Count = reader->ReadUInt32(NSTokens::Key::u32Val, true);
        }